

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericTypes.hpp
# Opt level: O1

string * sdglib::str_rc(string *__return_storage_ptr__,string *sequence)

{
  byte bVar1;
  size_type sVar2;
  ulong uVar3;
  char cVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sequence->_M_string_length);
  sVar2 = sequence->_M_string_length;
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      sVar2 = sVar2 - 1;
      bVar1 = (sequence->_M_dataplus)._M_p[sVar2];
      if (bVar1 < 0x61) {
        if (0x46 < bVar1) {
          if (bVar1 == 0x47) {
            cVar4 = 'C';
          }
          else {
            if (bVar1 != 0x54) goto LAB_0018a6c8;
            cVar4 = 'A';
          }
          goto LAB_0018a6c1;
        }
        cVar4 = 'T';
        if (bVar1 == 0x41) goto LAB_0018a6c1;
        if (bVar1 == 0x43) {
          cVar4 = 'G';
          goto LAB_0018a6c1;
        }
      }
      else {
        if (bVar1 < 0x67) {
          if (bVar1 == 0x61) {
            cVar4 = 't';
          }
          else {
            if (bVar1 != 99) goto LAB_0018a6c8;
            cVar4 = 'g';
          }
        }
        else if (bVar1 == 0x67) {
          cVar4 = 'c';
        }
        else {
          if (bVar1 != 0x74) goto LAB_0018a6c8;
          cVar4 = 'a';
        }
LAB_0018a6c1:
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = cVar4;
      }
LAB_0018a6c8:
      uVar3 = uVar3 + 1;
    } while (uVar3 < sequence->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string str_rc(const std::string &sequence) {
        std::string rseq;
        rseq.resize(sequence.size());
        for (size_t i = 0, j = sequence.size() - 1; i < sequence.size(); ++i, --j) {
            switch (sequence[j]) {
                case 'A':
                    rseq[i] = 'T';
                    break;
                case 'C':
                    rseq[i] = 'G';
                    break;
                case 'G':
                    rseq[i] = 'C';
                    break;
                case 'T':
                    rseq[i] = 'A';
                    break;
                case 'a':
                    rseq[i] = 't';
                    break;
                case 'c':
                    rseq[i] = 'g';
                    break;
                case 'g':
                    rseq[i] = 'c';
                    break;
                case 't':
                    rseq[i] = 'a';
                    break;
            }
        }
        return rseq;
    }